

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

StringLocalizationInfo * __thiscall
icu_63::LocDataParser::parse(LocDataParser *this,UChar *_data,int32_t len)

{
  UBool UVar1;
  int32_t len_local;
  UChar *_data_local;
  LocDataParser *this_local;
  
  UVar1 = ::U_FAILURE(*this->ec);
  if (UVar1 == '\0') {
    this->pe->line = 0;
    this->pe->offset = -1;
    this->pe->postContext[0] = L'\0';
    this->pe->preContext[0] = L'\0';
    if (_data == (UChar *)0x0) {
      *this->ec = U_ILLEGAL_ARGUMENT_ERROR;
      this_local = (LocDataParser *)0x0;
    }
    else if (len < 1) {
      *this->ec = U_ILLEGAL_ARGUMENT_ERROR;
      uprv_free_63(_data);
      this_local = (LocDataParser *)0x0;
    }
    else {
      this->data = _data;
      this->e = this->data + len;
      this->p = _data;
      this->ch = L'\xffff';
      this_local = (LocDataParser *)doParse(this);
    }
  }
  else {
    if (_data != (UChar *)0x0) {
      uprv_free_63(_data);
    }
    this_local = (LocDataParser *)0x0;
  }
  return (StringLocalizationInfo *)this_local;
}

Assistant:

StringLocalizationInfo*
LocDataParser::parse(UChar* _data, int32_t len) {
    if (U_FAILURE(ec)) {
        if (_data) uprv_free(_data);
        return NULL;
    }

    pe.line = 0;
    pe.offset = -1;
    pe.postContext[0] = 0;
    pe.preContext[0] = 0;

    if (_data == NULL) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if (len <= 0) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        uprv_free(_data);
        return NULL;
    }

    data = _data;
    e = data + len;
    p = _data;
    ch = 0xffff;

    return doParse();
}